

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall Renderer::setPatternRepeat(Renderer *this,bool repeat)

{
  bool bVar1;
  RenderContext *pRVar2;
  int __type;
  undefined1 local_30 [39];
  bool repeat_local;
  Renderer *this_local;
  
  local_30[0x1f] = repeat;
  unique0x10000098 = (_func_int **)this;
  bVar1 = AudioStream::isEnabled(&this->mStream);
  if (bVar1) {
    Guarded<Renderer::RenderContext>::access
              ((Guarded<Renderer::RenderContext> *)local_30,(char *)&this->mContext,__type);
    pRVar2 = Locked<Renderer::RenderContext>::operator->
                       ((Locked<Renderer::RenderContext> *)local_30);
    trackerboy::Engine::repeatPattern(&pRVar2->engine,(bool)(local_30[0x1f] & 1));
    Locked<Renderer::RenderContext>::~Locked((Locked<Renderer::RenderContext> *)local_30);
  }
  return;
}

Assistant:

void Renderer::setPatternRepeat(bool repeat) {

    if (mStream.isEnabled()) {
        mContext.access()->engine.repeatPattern(repeat);
    }
}